

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  SASL *sasl;
  short sVar2;
  connectdata *conn;
  bool bVar3;
  byte bVar4;
  int iVar5;
  CURLcode CVar6;
  char *pcVar7;
  char *first;
  size_t len;
  
  conn = data->conn;
  *done = false;
  CVar6 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = imap_statemachine;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).imapc.preftype = '\x03';
  sasl = &(conn->proto).imapc.sasl;
  Curl_sasl_init(sasl,data,&saslimap);
  Curl_dyn_init(&(conn->proto).imapc.dyn,0x10000);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  if (first == (char *)0x0) {
    bVar3 = false;
  }
  else {
    pcVar7 = first;
    if (*first == '\0') {
      bVar3 = false;
      CVar6 = CURLE_OK;
    }
    else {
      do {
        for (; (*pcVar7 != '\0' && (*pcVar7 != '=')); pcVar7 = pcVar7 + 1) {
        }
        pcVar1 = pcVar7 + 1;
        len = 0xffffffffffffffff;
        for (; (*pcVar7 != '\0' && (*pcVar7 != ';')); pcVar7 = pcVar7 + 1) {
          len = len + 1;
        }
        iVar5 = curl_strnequal(first,"AUTH=+LOGIN",0xb);
        bVar3 = iVar5 != 0;
        if (iVar5 == 0) {
          iVar5 = curl_strnequal(first,"AUTH=",5);
          if (iVar5 == 0) {
            CVar6 = CURLE_URL_MALFORMAT;
          }
          else {
            CVar6 = Curl_sasl_parse_url_auth_option(sasl,pcVar1,len);
          }
        }
        else {
          *(undefined2 *)((long)&conn->proto + 0xba) = 0;
          CVar6 = CURLE_OK;
        }
      } while ((CVar6 == CURLE_OK) &&
              (first = pcVar7 + (*pcVar7 == ';'), pcVar1 = pcVar7 + (*pcVar7 == ';'), pcVar7 = first
              , *pcVar1 != '\0'));
    }
  }
  bVar4 = 1;
  if (!bVar3) {
    sVar2 = *(short *)((long)&conn->proto + 0xba);
    bVar4 = sVar2 == -0x21 | 2;
    if (sVar2 == 0) {
      bVar4 = 0;
    }
  }
  (conn->proto).imapc.preftype = bVar4;
  if (CVar6 == CURLE_OK) {
    (data->conn->proto).imapc.state = IMAP_SERVERGREET;
    *(undefined2 *)((long)&conn->proto + 0xf4) = 0x2a;
    CVar6 = imap_multi_statemach(data,done);
    return CVar6;
  }
  return CVar6;
}

Assistant:

static CURLcode imap_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  PINGPONG_SETUP(pp, imap_statemachine, imap_endofresp);

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, data, &saslimap);

  Curl_dyn_init(&imapc->dyn, DYN_IMAP_CMD);
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  imap_state(data, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(data, done);

  return result;
}